

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O1

void bench_ellswift_create(void *arg,int iters)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  char cVar4;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  bool bVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  char *pcVar27;
  ulong uVar28;
  undefined1 *puVar29;
  void *pvVar30;
  void *pvVar31;
  void *pvVar32;
  long lVar33;
  uint uVar34;
  undefined8 *puVar35;
  long lVar36;
  char **argv;
  int argc;
  undefined8 *puVar37;
  ulong uVar39;
  char **ppcVar40;
  ulong uVar41;
  size_t __size;
  undefined8 *puVar42;
  char cVar43;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  undefined1 auVar44 [16];
  char cVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar68;
  short sVar69;
  undefined1 auVar76 [16];
  short sVar77;
  short sVar78;
  undefined1 auVar83 [12];
  undefined1 auVar88 [16];
  undefined4 uVar90;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  uchar buf [64];
  int in_stack_fffffffffffffce8;
  undefined8 auStack_2f0 [2];
  void *pvStack_2e0;
  void *pvStack_2d8;
  void *pvStack_2d0;
  void *pvStack_2c8;
  long lStack_2c0;
  undefined1 uStack_2b8;
  undefined1 uStack_2b7;
  undefined1 uStack_2b6;
  undefined1 uStack_2b5;
  undefined8 uStack_2b4;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 uStack_2a0;
  undefined8 uStack_290;
  char acStack_288 [32];
  undefined1 auStack_268 [32];
  undefined1 auStack_248 [72];
  undefined8 uStack_200;
  undefined1 auStack_1f8 [40];
  undefined8 uStack_1d0;
  undefined8 auStack_1c8 [13];
  undefined1 auStack_160 [64];
  undefined1 auStack_120 [64];
  undefined8 uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  undefined8 *puStack_c8;
  undefined8 *puStack_c0;
  code *pcStack_b8;
  int iStack_ac;
  undefined8 *puStack_a8;
  undefined8 uStack_a0;
  ulong uStack_98;
  long lStack_90;
  undefined1 *puStack_88;
  void *pvStack_80;
  undefined8 *puStack_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  undefined8 uVar38;
  long lVar53;
  undefined4 uVar70;
  undefined6 uVar71;
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  undefined1 auVar74 [14];
  undefined1 auVar75 [14];
  undefined4 uVar79;
  undefined6 uVar80;
  undefined8 uVar81;
  undefined1 auVar82 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [14];
  undefined1 auVar86 [14];
  undefined1 auVar87 [14];
  undefined1 auVar89 [16];
  undefined6 uVar91;
  undefined8 uVar92;
  undefined1 auVar93 [12];
  undefined1 auVar94 [14];
  undefined1 auVar97 [16];
  
  if (iters < 1) {
    return;
  }
  uVar28 = (ulong)(uint)iters;
  puVar1 = (undefined8 *)((long)arg + 0x4008);
  while( true ) {
    puVar37 = *arg;
    iStack_ac = (int)&local_68;
    iVar24 = secp256k1_ellswift_create(puVar37,&local_68,puVar1,(long)arg + 0x4028);
    if (iVar24 == 0) break;
    *(undefined8 *)((long)arg + 0x4038) = local_38;
    *(undefined8 *)((long)arg + 0x4040) = uStack_30;
    *(undefined8 *)((long)arg + 0x4028) = local_48;
    *(undefined8 *)((long)arg + 0x4030) = uStack_40;
    *(undefined8 *)((long)arg + 0x4018) = local_58;
    *(undefined8 *)((long)arg + 0x4020) = uStack_50;
    *puVar1 = local_68;
    *(undefined8 *)((long)arg + 0x4010) = uStack_60;
    uVar34 = (int)uVar28 - 1;
    uVar28 = (ulong)uVar34;
    if (uVar34 == 0) {
      return;
    }
  }
  bench_ellswift_create_cold_1();
  if (iStack_ac < 1) {
    return;
  }
  puVar2 = puVar37 + 0x801;
  uStack_a0 = _secp256k1_ellswift_xdh_hash_function_bip324;
  puVar35 = puVar37 + 0x803;
  uVar39 = 0x10;
  uVar41 = 0;
  puVar42 = puVar2;
  puStack_a8 = puVar37;
  uStack_98 = uVar28;
  lStack_90 = (long)arg + 0x4028;
  puStack_88 = (undefined1 *)&local_68;
  pvStack_80 = arg;
  puStack_78 = puVar1;
  while( true ) {
    argv = (char **)((long)puVar42 + (uVar41 / 0x21) * -0x21);
    uVar38 = *puStack_a8;
    pcStack_b8 = (code *)0x0;
    puStack_c0 = (undefined8 *)uStack_a0;
    puStack_c8 = (undefined8 *)0x102fe0;
    iVar24 = secp256k1_ellswift_xdh
                       (uVar38,argv,puVar2,puVar2,(long)puVar35 + (uVar39 / 0x21) * -0x21);
    argc = (int)uVar38;
    if (iVar24 != 1) break;
    uVar41 = uVar41 + 1;
    puVar35 = (undefined8 *)((long)puVar35 + 1);
    uVar39 = uVar39 + 1;
    puVar42 = (undefined8 *)((long)puVar42 + 1);
    if (iStack_ac == (int)uVar41) {
      return;
    }
  }
  pcStack_b8 = main;
  bench_ellswift_xdh_cold_1();
  uStack_e0 = 0xf83e0f83e0f83e1;
  uStack_d8 = uVar39;
  uStack_d0 = uVar41;
  puStack_c8 = puVar2;
  puStack_c0 = puVar42;
  pcStack_b8 = (code *)puVar35;
  pcVar27 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar27 == (char *)0x0) {
    uVar28 = 20000;
  }
  else {
    uVar28 = strtol(pcVar27,(char **)0x0,0);
  }
  bVar23 = true;
  if (argc != 1) {
    ppcVar40 = argv + 1;
    do {
      pcVar27 = *ppcVar40;
      lVar36 = 0;
      while (iVar24 = strcmp(pcVar27,*(char **)((long)&PTR_anon_var_dwarf_d5_00108d20 + lVar36)),
            iVar24 != 0) {
        lVar36 = lVar36 + 8;
        if (lVar36 == 0xa8) {
          bVar23 = false;
          goto LAB_001030c7;
        }
      }
      ppcVar40 = ppcVar40 + 1;
    } while (ppcVar40 != argv + argc);
    bVar23 = true;
  }
LAB_001030c7:
  lVar36 = (long)argc * 8;
  if (1 < argc) {
    lVar33 = 8;
    do {
      lVar53 = lVar33;
      if (lVar36 - lVar53 == 0) goto LAB_0010310a;
      pcVar27 = *(char **)((long)argv + lVar53);
      iVar24 = strcmp(pcVar27,"-h");
      iVar25 = (int)pcVar27;
      lVar33 = lVar53 + 8;
    } while (iVar24 != 0);
    if (lVar36 - lVar53 != 0) {
LAB_00103164:
      help(iVar25);
      return;
    }
LAB_0010310a:
    lVar33 = 8;
    do {
      lVar53 = lVar33;
      if (lVar36 - lVar53 == 0) goto LAB_00103137;
      pcVar27 = *(char **)((long)argv + lVar53);
      iVar24 = strcmp(pcVar27,"--help");
      iVar25 = (int)pcVar27;
      lVar33 = lVar53 + 8;
    } while (iVar24 != 0);
    if (lVar36 - lVar53 != 0) goto LAB_00103164;
LAB_00103137:
    lVar33 = 8;
    do {
      lVar53 = lVar33;
      if (lVar36 - lVar53 == 0) goto LAB_0010316e;
      pcVar27 = *(char **)((long)argv + lVar53);
      iVar24 = strcmp(pcVar27,"help");
      iVar25 = (int)pcVar27;
      lVar33 = lVar53 + 8;
    } while (iVar24 != 0);
    if (lVar36 - lVar53 != 0) goto LAB_00103164;
LAB_0010316e:
    if (!bVar23) {
      main_cold_1();
      return;
    }
  }
  lVar33 = 8;
  do {
    lVar53 = lVar33;
    if (lVar36 - lVar53 == 0) goto LAB_001031aa;
    iVar24 = strcmp(*(char **)((long)argv + lVar53),"recover");
    lVar33 = lVar53 + 8;
  } while (iVar24 != 0);
  if (lVar36 - lVar53 != 0) {
LAB_00103a45:
    main_cold_2();
    return;
  }
LAB_001031aa:
  lVar33 = 8;
  do {
    lVar53 = lVar33;
    if (lVar36 - lVar53 == 0) goto LAB_001031db;
    iVar24 = strcmp(*(char **)((long)argv + lVar53),"ecdsa_recover");
    lVar33 = lVar53 + 8;
  } while (iVar24 != 0);
  if (lVar36 - lVar53 != 0) goto LAB_00103a45;
LAB_001031db:
  uStack_290 = secp256k1_context_create(1);
  lVar33 = 8;
  auVar44 = _DAT_00105010;
  auVar61 = _DAT_00105020;
  auVar62 = _DAT_00105030;
  auVar63 = _DAT_00105040;
  auVar64 = _DAT_00105050;
  auVar65 = _DAT_00105060;
  auVar66 = _DAT_00105070;
  auVar67 = _DAT_00105080;
  do {
    auVar76 = auVar67 & _DAT_00105090;
    auVar88 = auVar66 & _DAT_00105090;
    sVar11 = auVar76._0_2_;
    cVar51 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[0] - (0xff < sVar11);
    sVar11 = auVar76._2_2_;
    sVar68 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar76[2] - (0xff < sVar11),cVar51);
    sVar11 = auVar76._4_2_;
    cVar43 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[4] - (0xff < sVar11);
    sVar11 = auVar76._6_2_;
    uVar70 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar76[6] - (0xff < sVar11),
                      CONCAT12(cVar43,sVar68));
    sVar11 = auVar76._8_2_;
    cVar45 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[8] - (0xff < sVar11);
    sVar11 = auVar76._10_2_;
    uVar71 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar76[10] - (0xff < sVar11),
                      CONCAT14(cVar45,uVar70));
    sVar11 = auVar76._12_2_;
    cVar46 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[0xc] - (0xff < sVar11);
    sVar11 = auVar76._14_2_;
    uVar38 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar76[0xe] - (0xff < sVar11),
                      CONCAT16(cVar46,uVar71));
    sVar11 = auVar88._0_2_;
    cVar47 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] - (0xff < sVar11);
    sVar11 = auVar88._2_2_;
    auVar72._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar88[2] - (0xff < sVar11),
                  CONCAT18(cVar47,uVar38));
    sVar11 = auVar88._4_2_;
    cVar48 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[4] - (0xff < sVar11);
    auVar72[10] = cVar48;
    sVar11 = auVar88._6_2_;
    auVar72[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar88[6] - (0xff < sVar11);
    sVar11 = auVar88._8_2_;
    cVar49 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[8] - (0xff < sVar11);
    auVar74[0xc] = cVar49;
    auVar74._0_12_ = auVar72;
    sVar11 = auVar88._10_2_;
    auVar74[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar88[10] - (0xff < sVar11);
    sVar11 = auVar88._12_2_;
    cVar50 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0xc] - (0xff < sVar11);
    auVar76[0xe] = cVar50;
    auVar76._0_14_ = auVar74;
    sVar11 = auVar88._14_2_;
    auVar76[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0xe] - (0xff < sVar11);
    auVar88 = auVar65 & _DAT_00105090;
    auVar95 = auVar64 & _DAT_00105090;
    sVar11 = auVar88._0_2_;
    cVar60 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] - (0xff < sVar11);
    sVar11 = auVar88._2_2_;
    sVar77 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar88[2] - (0xff < sVar11),cVar60);
    sVar11 = auVar88._4_2_;
    cVar59 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[4] - (0xff < sVar11);
    sVar11 = auVar88._6_2_;
    uVar79 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar88[6] - (0xff < sVar11),
                      CONCAT12(cVar59,sVar77));
    sVar11 = auVar88._8_2_;
    cVar52 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[8] - (0xff < sVar11);
    sVar11 = auVar88._10_2_;
    uVar80 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar88[10] - (0xff < sVar11),
                      CONCAT14(cVar52,uVar79));
    sVar11 = auVar88._12_2_;
    cVar58 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0xc] - (0xff < sVar11);
    sVar11 = auVar88._14_2_;
    uVar81 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar88[0xe] - (0xff < sVar11),
                      CONCAT16(cVar58,uVar80));
    sVar11 = auVar95._0_2_;
    cVar57 = (0 < sVar11) * (sVar11 < 0x100) * auVar95[0] - (0xff < sVar11);
    sVar11 = auVar95._2_2_;
    auVar82._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar95[2] - (0xff < sVar11),
                  CONCAT18(cVar57,uVar81));
    sVar11 = auVar95._4_2_;
    cVar56 = (0 < sVar11) * (sVar11 < 0x100) * auVar95[4] - (0xff < sVar11);
    auVar82[10] = cVar56;
    sVar11 = auVar95._6_2_;
    auVar82[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar95[6] - (0xff < sVar11);
    sVar11 = auVar95._8_2_;
    cVar55 = (0 < sVar11) * (sVar11 < 0x100) * auVar95[8] - (0xff < sVar11);
    auVar85[0xc] = cVar55;
    auVar85._0_12_ = auVar82;
    sVar11 = auVar95._10_2_;
    auVar85[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar95[10] - (0xff < sVar11);
    sVar11 = auVar95._12_2_;
    cVar54 = (0 < sVar11) * (sVar11 < 0x100) * auVar95[0xc] - (0xff < sVar11);
    auVar96[0xe] = cVar54;
    auVar96._0_14_ = auVar85;
    sVar11 = auVar95._14_2_;
    auVar96[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar95[0xe] - (0xff < sVar11);
    cVar3 = (0 < sVar68) * (sVar68 < 0x100) * cVar51 - (0xff < sVar68);
    sVar11 = (short)((uint)uVar70 >> 0x10);
    sVar69 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * cVar43 - (0xff < sVar11),cVar3);
    sVar11 = (short)((uint6)uVar71 >> 0x20);
    cVar51 = (0 < sVar11) * (sVar11 < 0x100) * cVar45 - (0xff < sVar11);
    sVar11 = (short)((ulong)uVar38 >> 0x30);
    uVar70 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar46 - (0xff < sVar11),
                      CONCAT12(cVar51,sVar69));
    sVar11 = (short)((unkuint10)auVar72._0_10_ >> 0x40);
    cVar43 = (0 < sVar11) * (sVar11 < 0x100) * cVar47 - (0xff < sVar11);
    sVar11 = auVar72._10_2_;
    uVar71 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * cVar48 - (0xff < sVar11),
                      CONCAT14(cVar43,uVar70));
    sVar11 = auVar74._12_2_;
    cVar49 = (0 < sVar11) * (sVar11 < 0x100) * cVar49 - (0xff < sVar11);
    sVar11 = auVar76._14_2_;
    uVar38 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * cVar50 - (0xff < sVar11),
                      CONCAT16(cVar49,uVar71));
    cVar48 = (0 < sVar77) * (sVar77 < 0x100) * cVar60 - (0xff < sVar77);
    sVar11 = (short)((uint)uVar79 >> 0x10);
    auVar73._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * cVar59 - (0xff < sVar11),CONCAT18(cVar48,uVar38)
                 );
    sVar11 = (short)((uint6)uVar80 >> 0x20);
    cVar47 = (0 < sVar11) * (sVar11 < 0x100) * cVar52 - (0xff < sVar11);
    auVar73[10] = cVar47;
    sVar11 = (short)((ulong)uVar81 >> 0x30);
    auVar73[0xb] = (0 < sVar11) * (sVar11 < 0x100) * cVar58 - (0xff < sVar11);
    sVar11 = (short)((unkuint10)auVar82._0_10_ >> 0x40);
    cVar46 = (0 < sVar11) * (sVar11 < 0x100) * cVar57 - (0xff < sVar11);
    auVar75[0xc] = cVar46;
    auVar75._0_12_ = auVar73;
    sVar11 = auVar82._10_2_;
    auVar75[0xd] = (0 < sVar11) * (sVar11 < 0x100) * cVar56 - (0xff < sVar11);
    sVar11 = auVar85._12_2_;
    cVar45 = (0 < sVar11) * (sVar11 < 0x100) * cVar55 - (0xff < sVar11);
    auVar88[0xe] = cVar45;
    auVar88._0_14_ = auVar75;
    sVar11 = auVar96._14_2_;
    auVar88[0xf] = (0 < sVar11) * (sVar11 < 0x100) * cVar54 - (0xff < sVar11);
    auVar76 = auVar63 & _DAT_00105090;
    auVar96 = auVar62 & _DAT_00105090;
    sVar11 = auVar76._0_2_;
    cVar50 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[0] - (0xff < sVar11);
    sVar11 = auVar76._2_2_;
    sVar68 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar76[2] - (0xff < sVar11),cVar50);
    sVar11 = auVar76._4_2_;
    cVar52 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[4] - (0xff < sVar11);
    sVar11 = auVar76._6_2_;
    uVar79 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar76[6] - (0xff < sVar11),
                      CONCAT12(cVar52,sVar68));
    sVar11 = auVar76._8_2_;
    cVar54 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[8] - (0xff < sVar11);
    sVar11 = auVar76._10_2_;
    uVar80 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar76[10] - (0xff < sVar11),
                      CONCAT14(cVar54,uVar79));
    sVar11 = auVar76._12_2_;
    cVar55 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[0xc] - (0xff < sVar11);
    sVar11 = auVar76._14_2_;
    uVar81 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar76[0xe] - (0xff < sVar11),
                      CONCAT16(cVar55,uVar80));
    sVar11 = auVar96._0_2_;
    cVar56 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[0] - (0xff < sVar11);
    sVar11 = auVar96._2_2_;
    auVar83._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar96[2] - (0xff < sVar11),
                  CONCAT18(cVar56,uVar81));
    sVar11 = auVar96._4_2_;
    cVar57 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[4] - (0xff < sVar11);
    auVar83[10] = cVar57;
    sVar11 = auVar96._6_2_;
    auVar83[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar96[6] - (0xff < sVar11);
    sVar11 = auVar96._8_2_;
    cVar58 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[8] - (0xff < sVar11);
    auVar86[0xc] = cVar58;
    auVar86._0_12_ = auVar83;
    sVar11 = auVar96._10_2_;
    auVar86[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar96[10] - (0xff < sVar11);
    sVar11 = auVar96._12_2_;
    cVar59 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[0xc] - (0xff < sVar11);
    auVar95[0xe] = cVar59;
    auVar95._0_14_ = auVar86;
    sVar11 = auVar96._14_2_;
    auVar95[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar96[0xe] - (0xff < sVar11);
    auVar76 = auVar61 & _DAT_00105090;
    auVar96 = auVar44 & _DAT_00105090;
    sVar11 = auVar76._0_2_;
    cVar60 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[0] - (0xff < sVar11);
    sVar11 = auVar76._2_2_;
    sVar77 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar76[2] - (0xff < sVar11),cVar60);
    sVar11 = auVar76._4_2_;
    cVar4 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[4] - (0xff < sVar11);
    sVar11 = auVar76._6_2_;
    uVar90 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar76[6] - (0xff < sVar11),
                      CONCAT12(cVar4,sVar77));
    sVar11 = auVar76._8_2_;
    cVar5 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[8] - (0xff < sVar11);
    sVar11 = auVar76._10_2_;
    uVar91 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar76[10] - (0xff < sVar11),
                      CONCAT14(cVar5,uVar90));
    sVar11 = auVar76._12_2_;
    cVar6 = (0 < sVar11) * (sVar11 < 0x100) * auVar76[0xc] - (0xff < sVar11);
    sVar11 = auVar76._14_2_;
    uVar92 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar76[0xe] - (0xff < sVar11),
                      CONCAT16(cVar6,uVar91));
    sVar11 = auVar96._0_2_;
    cVar7 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[0] - (0xff < sVar11);
    sVar11 = auVar96._2_2_;
    auVar93._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar96[2] - (0xff < sVar11),
                  CONCAT18(cVar7,uVar92));
    sVar11 = auVar96._4_2_;
    cVar8 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[4] - (0xff < sVar11);
    auVar93[10] = cVar8;
    sVar11 = auVar96._6_2_;
    auVar93[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar96[6] - (0xff < sVar11);
    sVar11 = auVar96._8_2_;
    cVar9 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[8] - (0xff < sVar11);
    auVar94[0xc] = cVar9;
    auVar94._0_12_ = auVar93;
    sVar11 = auVar96._10_2_;
    auVar94[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar96[10] - (0xff < sVar11);
    sVar11 = auVar96._12_2_;
    cVar10 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[0xc] - (0xff < sVar11);
    auVar97[0xe] = cVar10;
    auVar97._0_14_ = auVar94;
    sVar11 = auVar96._14_2_;
    auVar97[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar96[0xe] - (0xff < sVar11);
    cVar50 = (0 < sVar68) * (sVar68 < 0x100) * cVar50 - (0xff < sVar68);
    sVar11 = (short)((uint)uVar79 >> 0x10);
    sVar78 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * cVar52 - (0xff < sVar11),cVar50);
    sVar11 = (short)((uint6)uVar80 >> 0x20);
    cVar52 = (0 < sVar11) * (sVar11 < 0x100) * cVar54 - (0xff < sVar11);
    sVar11 = (short)((ulong)uVar81 >> 0x30);
    uVar79 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar55 - (0xff < sVar11),
                      CONCAT12(cVar52,sVar78));
    sVar11 = (short)((unkuint10)auVar83._0_10_ >> 0x40);
    cVar54 = (0 < sVar11) * (sVar11 < 0x100) * cVar56 - (0xff < sVar11);
    sVar11 = auVar83._10_2_;
    uVar80 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * cVar57 - (0xff < sVar11),
                      CONCAT14(cVar54,uVar79));
    sVar11 = auVar86._12_2_;
    cVar55 = (0 < sVar11) * (sVar11 < 0x100) * cVar58 - (0xff < sVar11);
    sVar11 = auVar95._14_2_;
    uVar81 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * cVar59 - (0xff < sVar11),
                      CONCAT16(cVar55,uVar80));
    cVar56 = (0 < sVar77) * (sVar77 < 0x100) * cVar60 - (0xff < sVar77);
    sVar11 = (short)((uint)uVar90 >> 0x10);
    auVar84._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11),CONCAT18(cVar56,uVar81))
    ;
    sVar11 = (short)((uint6)uVar91 >> 0x20);
    cVar57 = (0 < sVar11) * (sVar11 < 0x100) * cVar5 - (0xff < sVar11);
    auVar84[10] = cVar57;
    sVar11 = (short)((ulong)uVar92 >> 0x30);
    auVar84[0xb] = (0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11);
    sVar11 = (short)((unkuint10)auVar93._0_10_ >> 0x40);
    cVar58 = (0 < sVar11) * (sVar11 < 0x100) * cVar7 - (0xff < sVar11);
    auVar87[0xc] = cVar58;
    auVar87._0_12_ = auVar84;
    sVar11 = auVar93._10_2_;
    auVar87[0xd] = (0 < sVar11) * (sVar11 < 0x100) * cVar8 - (0xff < sVar11);
    sVar11 = auVar94._12_2_;
    cVar59 = (0 < sVar11) * (sVar11 < 0x100) * cVar9 - (0xff < sVar11);
    auVar89[0xe] = cVar59;
    auVar89._0_14_ = auVar87;
    sVar11 = auVar97._14_2_;
    auVar89[0xf] = (0 < sVar11) * (sVar11 < 0x100) * cVar10 - (0xff < sVar11);
    sVar11 = (short)((uint)uVar70 >> 0x10);
    sVar68 = (short)((uint6)uVar71 >> 0x20);
    sVar77 = (short)((ulong)uVar38 >> 0x30);
    sVar12 = (short)((unkuint10)auVar73._0_10_ >> 0x40);
    sVar13 = auVar73._10_2_;
    sVar14 = auVar75._12_2_;
    sVar15 = auVar88._14_2_;
    sVar16 = (short)((uint)uVar79 >> 0x10);
    sVar17 = (short)((uint6)uVar80 >> 0x20);
    sVar18 = (short)((ulong)uVar81 >> 0x30);
    sVar19 = (short)((unkuint10)auVar84._0_10_ >> 0x40);
    sVar20 = auVar84._10_2_;
    sVar21 = auVar87._12_2_;
    sVar22 = auVar89._14_2_;
    acStack_288[lVar33 + -8] = ((0 < sVar69) * (sVar69 < 0x100) * cVar3 - (0xff < sVar69)) + '\x01';
    acStack_288[lVar33 + -7] = ((0 < sVar11) * (sVar11 < 0x100) * cVar51 - (0xff < sVar11)) + '\x01'
    ;
    acStack_288[lVar33 + -6] = ((0 < sVar68) * (sVar68 < 0x100) * cVar43 - (0xff < sVar68)) + '\x01'
    ;
    acStack_288[lVar33 + -5] = ((0 < sVar77) * (sVar77 < 0x100) * cVar49 - (0xff < sVar77)) + '\x01'
    ;
    acStack_288[lVar33 + -4] = ((0 < sVar12) * (sVar12 < 0x100) * cVar48 - (0xff < sVar12)) + '\x01'
    ;
    acStack_288[lVar33 + -3] = ((0 < sVar13) * (sVar13 < 0x100) * cVar47 - (0xff < sVar13)) + '\x01'
    ;
    acStack_288[lVar33 + -2] = ((0 < sVar14) * (sVar14 < 0x100) * cVar46 - (0xff < sVar14)) + '\x01'
    ;
    acStack_288[lVar33 + -1] = ((0 < sVar15) * (sVar15 < 0x100) * cVar45 - (0xff < sVar15)) + '\x01'
    ;
    acStack_288[lVar33] = ((0 < sVar78) * (sVar78 < 0x100) * cVar50 - (0xff < sVar78)) + '\x01';
    acStack_288[lVar33 + 1] = ((0 < sVar16) * (sVar16 < 0x100) * cVar52 - (0xff < sVar16)) + '\x01';
    acStack_288[lVar33 + 2] = ((0 < sVar17) * (sVar17 < 0x100) * cVar54 - (0xff < sVar17)) + '\x01';
    acStack_288[lVar33 + 3] = ((0 < sVar18) * (sVar18 < 0x100) * cVar55 - (0xff < sVar18)) + '\x01';
    acStack_288[lVar33 + 4] = ((0 < sVar19) * (sVar19 < 0x100) * cVar56 - (0xff < sVar19)) + '\x01';
    acStack_288[lVar33 + 5] = ((0 < sVar20) * (sVar20 < 0x100) * cVar57 - (0xff < sVar20)) + '\x01';
    acStack_288[lVar33 + 6] = ((0 < sVar21) * (sVar21 < 0x100) * cVar58 - (0xff < sVar21)) + '\x01';
    acStack_288[lVar33 + 7] = ((0 < sVar22) * (sVar22 < 0x100) * cVar59 - (0xff < sVar22)) + '\x01';
    lVar53 = auVar67._8_8_;
    auVar67._0_8_ = auVar67._0_8_ + 0x10;
    auVar67._8_8_ = lVar53 + 0x10;
    lVar53 = auVar66._8_8_;
    auVar66._0_8_ = auVar66._0_8_ + 0x10;
    auVar66._8_8_ = lVar53 + 0x10;
    lVar53 = auVar65._8_8_;
    auVar65._0_8_ = auVar65._0_8_ + 0x10;
    auVar65._8_8_ = lVar53 + 0x10;
    lVar53 = auVar64._8_8_;
    auVar64._0_8_ = auVar64._0_8_ + 0x10;
    auVar64._8_8_ = lVar53 + 0x10;
    lVar53 = auVar63._8_8_;
    auVar63._0_8_ = auVar63._0_8_ + 0x10;
    auVar63._8_8_ = lVar53 + 0x10;
    lVar53 = auVar62._8_8_;
    auVar62._0_8_ = auVar62._0_8_ + 0x10;
    auVar62._8_8_ = lVar53 + 0x10;
    lVar53 = auVar61._8_8_;
    auVar61._0_8_ = auVar61._0_8_ + 0x10;
    auVar61._8_8_ = lVar53 + 0x10;
    lVar53 = auVar44._8_8_;
    auVar44._0_8_ = auVar44._0_8_ + 0x10;
    auVar44._8_8_ = lVar53 + 0x10;
    lVar33 = lVar33 + 0x10;
  } while (lVar33 != 0x28);
  cVar43 = '\0';
  cVar45 = '\x01';
  cVar46 = '\x02';
  cVar47 = '\x03';
  cVar48 = '\x04';
  cVar49 = '\x05';
  cVar50 = '\x06';
  cVar51 = '\a';
  cVar52 = '\b';
  cVar54 = '\t';
  cVar55 = '\n';
  cVar56 = '\v';
  cVar57 = '\f';
  cVar58 = '\r';
  cVar59 = '\x0e';
  cVar60 = '\x0f';
  lVar33 = 0x28;
  do {
    acStack_288[lVar33 + -8] = cVar43 + DAT_001050c0;
    acStack_288[lVar33 + -7] = cVar45 + DAT_001050c0._1_1_;
    acStack_288[lVar33 + -6] = cVar46 + DAT_001050c0._2_1_;
    acStack_288[lVar33 + -5] = cVar47 + DAT_001050c0._3_1_;
    acStack_288[lVar33 + -4] = cVar48 + DAT_001050c0._4_1_;
    acStack_288[lVar33 + -3] = cVar49 + DAT_001050c0._5_1_;
    acStack_288[lVar33 + -2] = cVar50 + DAT_001050c0._6_1_;
    acStack_288[lVar33 + -1] = cVar51 + DAT_001050c0._7_1_;
    acStack_288[lVar33] = cVar52 + DAT_001050c0._8_1_;
    acStack_288[lVar33 + 1] = cVar54 + DAT_001050c0._9_1_;
    acStack_288[lVar33 + 2] = cVar55 + DAT_001050c0._10_1_;
    acStack_288[lVar33 + 3] = cVar56 + DAT_001050c0._11_1_;
    acStack_288[lVar33 + 4] = cVar57 + DAT_001050c0._12_1_;
    acStack_288[lVar33 + 5] = cVar58 + DAT_001050c0._13_1_;
    acStack_288[lVar33 + 6] = cVar59 + DAT_001050c0._14_1_;
    acStack_288[lVar33 + 7] = cVar60 + DAT_001050c0._15_1_;
    cVar43 = cVar43 + DAT_001050d0;
    cVar45 = cVar45 + DAT_001050d0._1_1_;
    cVar46 = cVar46 + DAT_001050d0._2_1_;
    cVar47 = cVar47 + DAT_001050d0._3_1_;
    cVar48 = cVar48 + DAT_001050d0._4_1_;
    cVar49 = cVar49 + DAT_001050d0._5_1_;
    cVar50 = cVar50 + DAT_001050d0._6_1_;
    cVar51 = cVar51 + DAT_001050d0._7_1_;
    cVar52 = cVar52 + DAT_001050d0._8_1_;
    cVar54 = cVar54 + DAT_001050d0._9_1_;
    cVar55 = cVar55 + DAT_001050d0._10_1_;
    cVar56 = cVar56 + DAT_001050d0._11_1_;
    cVar57 = cVar57 + DAT_001050d0._12_1_;
    cVar58 = cVar58 + DAT_001050d0._13_1_;
    cVar59 = cVar59 + DAT_001050d0._14_1_;
    cVar60 = cVar60 + DAT_001050d0._15_1_;
    lVar33 = lVar33 + 0x10;
  } while (lVar33 != 0x48);
  uStack_200 = 0x48;
  uVar38 = 0;
  iVar24 = secp256k1_ecdsa_sign(uStack_290,auStack_160,acStack_288,auStack_268,0);
  if (iVar24 == 0) {
LAB_00103a6c:
    main_cold_10();
LAB_00103a71:
    main_cold_9();
  }
  else {
    iVar24 = secp256k1_ecdsa_signature_serialize_der(uStack_290,auStack_248,&uStack_200,auStack_160)
    ;
    if (iVar24 == 0) goto LAB_00103a71;
    iVar24 = secp256k1_ec_pubkey_create(uStack_290,auStack_120,auStack_268);
    if (iVar24 != 0) {
      uStack_1d0 = 0x21;
      iVar24 = secp256k1_ec_pubkey_serialize(uStack_290,auStack_1f8,&uStack_1d0,auStack_120,0x102);
      if (iVar24 != 1) goto LAB_00103a7b;
      printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
             "    Max(us)    ");
      putchar(10);
      iVar24 = (int)uVar28;
      if (argc == 1) {
LAB_001034c3:
        run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr_int *)&uStack_290,(void *)(uVar28 & 0xffffffff),
                      (int)uVar38,in_stack_fffffffffffffce8);
      }
      else {
        lVar33 = 8;
        do {
          lVar53 = lVar33;
          if (lVar36 - lVar53 == 0) goto LAB_00103469;
          iVar25 = strcmp(*(char **)((long)argv + lVar53),"ecdsa");
          lVar33 = lVar53 + 8;
        } while (iVar25 != 0);
        if (lVar36 - lVar53 != 0) goto LAB_001034c3;
LAB_00103469:
        lVar33 = 8;
        do {
          lVar53 = lVar33;
          if (lVar36 - lVar53 == 0) goto LAB_00103496;
          iVar25 = strcmp(*(char **)((long)argv + lVar53),"verify");
          lVar33 = lVar53 + 8;
        } while (iVar25 != 0);
        if (lVar36 - lVar53 != 0) goto LAB_001034c3;
LAB_00103496:
        lVar33 = 8;
        do {
          lVar53 = lVar33;
          if (lVar36 - lVar53 == 0) goto LAB_001034e3;
          iVar25 = strcmp(*(char **)((long)argv + lVar53),"ecdsa_verify");
          lVar33 = lVar53 + 8;
        } while (iVar25 != 0);
        if (lVar36 - lVar53 != 0) goto LAB_001034c3;
      }
LAB_001034e3:
      if (argc == 1) {
LAB_00103573:
        run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,
                      (_func_void_void_ptr_int *)&uStack_290,(void *)(uVar28 & 0xffffffff),
                      (int)uVar38,in_stack_fffffffffffffce8);
      }
      else {
        lVar33 = 8;
        do {
          lVar53 = lVar33;
          if (lVar36 - lVar53 == 0) goto LAB_00103519;
          iVar25 = strcmp(*(char **)((long)argv + lVar53),"ecdsa");
          lVar33 = lVar53 + 8;
        } while (iVar25 != 0);
        if (lVar36 - lVar53 != 0) goto LAB_00103573;
LAB_00103519:
        lVar33 = 8;
        do {
          lVar53 = lVar33;
          if (lVar36 - lVar53 == 0) goto LAB_00103546;
          iVar25 = strcmp(*(char **)((long)argv + lVar53),"sign");
          lVar33 = lVar53 + 8;
        } while (iVar25 != 0);
        if (lVar36 - lVar53 != 0) goto LAB_00103573;
LAB_00103546:
        lVar33 = 8;
        do {
          lVar53 = lVar33;
          if (lVar36 - lVar53 == 0) goto LAB_00103598;
          iVar25 = strcmp(*(char **)((long)argv + lVar53),"ecdsa_sign");
          lVar33 = lVar53 + 8;
        } while (iVar25 != 0);
        if (lVar36 - lVar53 != 0) goto LAB_00103573;
      }
LAB_00103598:
      if (argc == 1) {
LAB_00103628:
        run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,
                      (_func_void_void_ptr_int *)&uStack_290,(void *)(uVar28 & 0xffffffff),
                      (int)uVar38,in_stack_fffffffffffffce8);
      }
      else {
        lVar33 = 8;
        do {
          lVar53 = lVar33;
          if (lVar36 - lVar53 == 0) goto LAB_001035ce;
          iVar25 = strcmp(*(char **)((long)argv + lVar53),"ec");
          lVar33 = lVar53 + 8;
        } while (iVar25 != 0);
        if (lVar36 - lVar53 != 0) goto LAB_00103628;
LAB_001035ce:
        lVar33 = 8;
        do {
          lVar53 = lVar33;
          if (lVar36 - lVar53 == 0) goto LAB_001035fb;
          iVar25 = strcmp(*(char **)((long)argv + lVar53),"keygen");
          lVar33 = lVar53 + 8;
        } while (iVar25 != 0);
        if (lVar36 - lVar53 != 0) goto LAB_00103628;
LAB_001035fb:
        lVar33 = 8;
        do {
          lVar53 = lVar33;
          if (lVar36 - lVar53 == 0) goto LAB_0010364d;
          iVar25 = strcmp(*(char **)((long)argv + lVar53),"ec_keygen");
          lVar33 = lVar53 + 8;
        } while (iVar25 != 0);
        if (lVar36 - lVar53 != 0) goto LAB_00103628;
      }
LAB_0010364d:
      secp256k1_context_destroy(uStack_290);
      auStack_1c8[0] = secp256k1_context_create(1);
      if (argc != 1) {
        lVar33 = 8;
        do {
          if (lVar36 - lVar33 == 0) goto LAB_001036bc;
          iVar25 = strcmp(*(char **)((long)argv + lVar33),"ecdh");
          lVar33 = lVar33 + 8;
        } while (iVar25 != 0);
      }
      run_benchmark("ecdh",bench_ecdh,bench_ecdh_setup,(_func_void_void_ptr_int *)auStack_1c8,
                    (void *)(uVar28 & 0xffffffff),(int)uVar38,in_stack_fffffffffffffce8);
LAB_001036bc:
      lStack_2c0 = lVar36;
      secp256k1_context_destroy(auStack_1c8[0]);
      auStack_2f0[0] = secp256k1_context_create(1);
      __size = (long)iVar24 << 3;
      pvStack_2e0 = malloc(__size);
      pvStack_2d8 = malloc(__size);
      pvStack_2c8 = malloc(__size);
      pvStack_2d0 = malloc(__size);
      if (0 < iVar24) {
        uVar39 = 0;
        do {
          puVar29 = (undefined1 *)malloc(0x20);
          pvVar30 = malloc(0x40);
          pvVar31 = malloc(0x60);
          pvVar32 = malloc(0x20);
          uStack_2b8 = (undefined1)uVar39;
          *puVar29 = uStack_2b8;
          uStack_2b7 = (undefined1)(uVar39 >> 8);
          puVar29[1] = uStack_2b7;
          uStack_2b6 = (undefined1)(uVar39 >> 0x10);
          puVar29[2] = uStack_2b6;
          uStack_2b5 = (undefined1)(uVar39 >> 0x18);
          puVar29[3] = uStack_2b5;
          *(undefined8 *)(puVar29 + 4) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar29 + 0xc) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar29 + 0x10) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar29 + 0x18) = 0x6d6d6d6d6d6d6d6d;
          uStack_2a4 = 0x73737373;
          uStack_2a0 = 0x7373737373737373;
          uStack_2b4 = 0x7373737373737373;
          uStack_2ac = 0x73737373;
          uStack_2a8 = 0x73737373;
          *(void **)((long)pvStack_2e0 + uVar39 * 8) = pvVar31;
          *(void **)((long)pvStack_2d8 + uVar39 * 8) = pvVar32;
          *(undefined1 **)((long)pvStack_2c8 + uVar39 * 8) = puVar29;
          *(void **)((long)pvStack_2d0 + uVar39 * 8) = pvVar30;
          iVar25 = secp256k1_keypair_create(auStack_2f0[0],pvVar31,&uStack_2b8);
          if (iVar25 == 0) {
            main_cold_7();
LAB_00103a5d:
            main_cold_6();
LAB_00103a62:
            main_cold_5();
LAB_00103a67:
            main_cold_4();
            goto LAB_00103a6c;
          }
          uVar38 = 0;
          iVar25 = secp256k1_schnorrsig_sign_custom(auStack_2f0[0],pvVar30,puVar29,0x20,pvVar31);
          if (iVar25 == 0) goto LAB_00103a5d;
          iVar25 = secp256k1_keypair_xonly_pub(auStack_2f0[0],auStack_1c8,0,pvVar31);
          if (iVar25 == 0) goto LAB_00103a62;
          iVar25 = secp256k1_xonly_pubkey_serialize(auStack_2f0[0],pvVar32,auStack_1c8);
          if (iVar25 != 1) goto LAB_00103a67;
          uVar39 = uVar39 + 1;
        } while ((uVar28 & 0xffffffff) != uVar39);
      }
      lVar36 = lStack_2c0;
      if (argc != 1) {
        lVar33 = 8;
        do {
          if (lVar36 == lVar33) {
            lVar33 = 8;
            goto LAB_001038b0;
          }
          iVar25 = strcmp(*(char **)((long)argv + lVar33),"schnorrsig");
          lVar33 = lVar33 + 8;
        } while (iVar25 != 0);
      }
      goto LAB_001038f1;
    }
  }
  main_cold_8();
LAB_00103a7b:
  main_cold_3();
  puts("Benchmarks the following algorithms:");
  puts("    - ECDSA signing/verification");
  puts("    - ECDH key exchange (optional module)");
  puts("    - Schnorr signatures (optional module)");
  putchar(10);
  printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
  puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
  putchar(10);
  puts("Usage: ./bench [args]");
  puts("By default, all benchmarks will be run.");
  puts("args:");
  puts("    help              : display this help and exit");
  puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
  puts("    ecdsa_sign        : ECDSA siging algorithm");
  puts("    ecdsa_verify      : ECDSA verification algorithm");
  puts("    ec                : all EC public key algorithms (keygen)");
  puts("    ec_keygen         : EC public key generation");
  puts("    ecdh              : ECDH key exchange algorithm");
  puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
  puts("    schnorrsig_sign   : Schnorr sigining algorithm");
  puts("    schnorrsig_verify : Schnorr verification algorithm");
  puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
  puts("    ellswift_encode   : ElligatorSwift encoding");
  puts("    ellswift_decode   : ElligatorSwift decoding");
  puts("    ellswift_keygen   : ElligatorSwift key generation");
  puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
  putchar(10);
  return;
  while( true ) {
    iVar25 = strcmp(*(char **)((long)argv + lVar33),"sign");
    lVar33 = lVar33 + 8;
    if (iVar25 == 0) break;
LAB_001038b0:
    if (lVar36 == lVar33) {
      lVar33 = 8;
      goto LAB_001038d8;
    }
  }
  goto LAB_001038f1;
  while( true ) {
    iVar26 = strcmp(*(char **)((long)argv + lVar33),"verify");
    iVar25 = (int)uVar38;
    lVar33 = lVar33 + 8;
    if (iVar26 == 0) break;
LAB_00103948:
    if (lVar36 == lVar33) {
      lVar33 = 8;
      goto LAB_00103970;
    }
  }
  goto LAB_00103989;
  while( true ) {
    iVar26 = strcmp(*(char **)((long)argv + lVar33),"schnorrsig_verify");
    iVar25 = (int)uVar38;
    lVar33 = lVar33 + 8;
    if (iVar26 == 0) break;
LAB_00103970:
    if (lVar36 == lVar33) goto LAB_001039a6;
  }
  goto LAB_00103989;
  while( true ) {
    iVar25 = strcmp(*(char **)((long)argv + lVar33),"schnorrsig_sign");
    lVar33 = lVar33 + 8;
    if (iVar25 == 0) break;
LAB_001038d8:
    if (lVar36 == lVar33) goto LAB_0010390e;
  }
LAB_001038f1:
  run_benchmark("schnorrsig_sign",bench_schnorrsig_sign,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)auStack_2f0,(void *)(uVar28 & 0xffffffff),(int)uVar38,
                in_stack_fffffffffffffce8);
LAB_0010390e:
  iVar25 = (int)uVar38;
  if (argc != 1) {
    lVar33 = 8;
    do {
      if (lVar36 == lVar33) {
        lVar33 = 8;
        goto LAB_00103948;
      }
      iVar26 = strcmp(*(char **)((long)argv + lVar33),"schnorrsig");
      iVar25 = (int)uVar38;
      lVar33 = lVar33 + 8;
    } while (iVar26 != 0);
  }
LAB_00103989:
  run_benchmark("schnorrsig_verify",bench_schnorrsig_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)auStack_2f0,(void *)(uVar28 & 0xffffffff),iVar25,
                in_stack_fffffffffffffce8);
LAB_001039a6:
  if (0 < iVar24) {
    uVar39 = 0;
    do {
      free(*(void **)((long)pvStack_2e0 + uVar39 * 8));
      free(*(void **)((long)pvStack_2d8 + uVar39 * 8));
      free(*(void **)((long)pvStack_2c8 + uVar39 * 8));
      free(*(void **)((long)pvStack_2d0 + uVar39 * 8));
      uVar39 = uVar39 + 1;
    } while ((uVar28 & 0xffffffff) != uVar39);
  }
  free(pvStack_2e0);
  free(pvStack_2d8);
  free(pvStack_2c8);
  free(pvStack_2d0);
  secp256k1_context_destroy(auStack_2f0[0]);
  run_ellswift_bench(iVar24,argc,argv);
  return;
}

Assistant:

static void bench_ellswift_create(void *arg, int iters) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        unsigned char buf[64];
        CHECK(secp256k1_ellswift_create(data->ctx, buf, data->rnd64, data->rnd64 + 32));
        memcpy(data->rnd64, buf, 64);
    }
}